

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O0

size_t maxArgWidth(poptOption *opt,char *translation_domain)

{
  long lVar1;
  size_t sVar2;
  char *s;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  poptOption *local_38;
  void *arg;
  char *argDescrip;
  size_t len;
  size_t max;
  char *translation_domain_local;
  poptOption *opt_local;
  
  len = 0;
  argDescrip = (char *)0x0;
  translation_domain_local = (char *)opt;
  if (opt != (poptOption *)0x0) {
    while( true ) {
      bVar5 = true;
      if ((*(long *)translation_domain_local == 0) &&
         (bVar5 = true, translation_domain_local[8] == '\0')) {
        bVar5 = *(long *)(translation_domain_local + 0x10) != 0;
      }
      if (!bVar5) break;
      if ((*(uint *)(translation_domain_local + 0xc) & _poptArgMask) == 4) {
        local_38 = *(poptOption **)(translation_domain_local + 0x10);
        if (local_38 == poptHelpOptions) {
          local_38 = poptHelpOptionsI18N;
        }
        if (local_38 != (poptOption *)0x0) {
          argDescrip = (char *)maxArgWidth(local_38,translation_domain);
        }
        if (len < argDescrip) {
          len = (size_t)argDescrip;
        }
      }
      else if ((*(uint *)(translation_domain_local + 0xc) & 0x40000000) == 0) {
        argDescrip = (char *)0x6;
        if (*(long *)translation_domain_local != 0) {
          lVar1 = 3;
          if ((*(uint *)(translation_domain_local + 0xc) & 0x80000000) != 0) {
            lVar1 = 2;
          }
          sVar2 = strlen(*(char **)translation_domain_local);
          argDescrip = (char *)(sVar2 + lVar1 + 5);
        }
        s = getArgDescrip((poptOption *)translation_domain_local,translation_domain);
        if (s != (char *)0x0) {
          pcVar3 = strchr(" =(",(int)*s);
          if (pcVar3 == (char *)0x0) {
            argDescrip = argDescrip + 1;
          }
          sVar4 = stringDisplayWidth(s);
          argDescrip = argDescrip + sVar4;
        }
        if ((*(uint *)(translation_domain_local + 0xc) & 0x10000000) != 0) {
          argDescrip = argDescrip + 2;
        }
        if (len < argDescrip) {
          len = (size_t)argDescrip;
        }
      }
      translation_domain_local = translation_domain_local + 0x30;
    }
  }
  return len;
}

Assistant:

static size_t maxArgWidth(const struct poptOption * opt,
		       const char * translation_domain)
{
    size_t max = 0;
    size_t len = 0;
    const char * argDescrip;
    
    if (opt != NULL)
    while (opt->longName || opt->shortName || opt->arg) {
	if (poptArgType(opt) == POPT_ARG_INCLUDE_TABLE) {
	    void * arg = opt->arg;
	    /* XXX sick hack to preserve pretense of ABI. */
	    if (arg == poptHelpOptions)
		arg = poptHelpOptionsI18N;
	    if (arg)	/* XXX program error */
		len = maxArgWidth(arg, translation_domain);
	    if (len > max) max = len;
	} else if (!F_ISSET(opt, DOC_HIDDEN)) {
	    len = sizeof("  ")-1;
	    /* XXX --long always padded for alignment with/without "-X, ". */
	    len += sizeof("-X, ")-1;
	    if (opt->longName) {
		len += (F_ISSET(opt, ONEDASH) ? sizeof("-") : sizeof("--")) - 1;
		len += strlen(opt->longName);
	    }

	    argDescrip = getArgDescrip(opt, translation_domain);

	    if (argDescrip) {

		/* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
		if (!strchr(" =(", argDescrip[0])) len += sizeof("=")-1;

		/* Adjust for (possible) wide characters. */
		len += stringDisplayWidth(argDescrip);
	    }

	    if (F_ISSET(opt, OPTIONAL)) len += sizeof("[]")-1;
	    if (len > max) max = len;
	}
	opt++;
    }
    
    return max;
}